

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CExpressionList *expression)

{
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar1;
  size_type sVar2;
  const_reference this_00;
  allocator local_e9;
  string local_e8 [32];
  ChildrenAnswers local_c8;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_98;
  undefined1 local_80 [8];
  ChildrenAnswers answers;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  CExpressionList *expression_local;
  PrintVisitor *this_local;
  
  children.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)expression;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  local_34 = 0;
  while( true ) {
    pvVar1 = CExpressionList::getExpressions
                       ((CExpressionList *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar2 = std::
            vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
            ::size(pvVar1);
    if (sVar2 <= (ulong)(long)local_34) break;
    pvVar1 = CExpressionList::getExpressions
                       ((CExpressionList *)
                        children.
                        super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ::operator[](pvVar1,(long)local_34);
    answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
                  get(this_00);
    std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::push_back
              ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30,
               (value_type *)
               &answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_34 = local_34 + 1;
  }
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&local_98,(vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_80,this,&local_98);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector(&local_98);
  ChildrenAnswers::ChildrenAnswers(&local_c8,(ChildrenAnswers *)local_80);
  AddChildrenAnswers(this,&local_c8);
  ChildrenAnswers::~ChildrenAnswers(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"ExpressionList",&local_e9);
  AddLabel(this,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_80);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)local_30);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CExpressionList &expression ) {
    std::vector<const IRT::INode *> children;
    for ( int i = 0; i < expression.getExpressions( ).size( ); ++i ) {
        children.push_back( expression.getExpressions( )[ i ].get( ));
    }
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "ExpressionList" );
    ++lastVisited;
}